

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitRefFunc(PrintExpressionContents *this,RefFunc *curr)

{
  string_view str;
  
  str._M_str = "ref.func ";
  str._M_len = 9;
  printMedium(this->o,str);
  Name::print(&curr->func,this->o);
  return;
}

Assistant:

void visitRefFunc(RefFunc* curr) {
    printMedium(o, "ref.func ");
    curr->func.print(o);
  }